

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O2

void __thiscall streams_tests::xor_file::test_method(xor_file *this)

{
  long lVar1;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_00;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_01;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_02;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_03;
  FILE *pFVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  string *psVar5;
  string *psVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<std::byte> __l_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  Span<const_unsigned_char> s;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  const_string file_09;
  Span<const_unsigned_char> s_02;
  Span<const_unsigned_char> s_03;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  Span<const_unsigned_char> s_04;
  Span<const_unsigned_char> s_05;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  undefined4 in_stack_fffffffffffff958;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffff95c;
  undefined4 uVar8;
  check_type cVar11;
  char *pcVar9;
  pointer in_stack_fffffffffffff968;
  char *pcVar10;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_548 [4];
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_430;
  vector<std::byte,_std::allocator<std::byte>_> read2;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_348;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_330 [3];
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  vector<std::byte,_std::allocator<std::byte>_> raw;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_178;
  vector<std::byte,_std::allocator<std::byte>_> xor_pat;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test1;
  AutoFile xor_file;
  string local_e8;
  string local_c8;
  lazy_ostream local_a8;
  undefined1 *local_98;
  char *local_90;
  path local_88;
  path xor_path;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  fs::operator/(&xor_path,(path *)&local_88,"test_xor.bin");
  std::filesystem::__cxx11::path::~path(&local_88);
  xor_file.m_file._0_2_ = 0x201;
  xor_file.m_file._2_1_ = 3;
  __l._M_len = 3;
  __l._M_array = (iterator)&xor_file;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&test1,__l,(allocator_type *)&local_a8);
  xor_file.m_file._0_2_ = 0x504;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&xor_file;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&test2,__l_00,(allocator_type *)&local_a8);
  xor_file.m_file._0_2_ = 0xff;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&xor_file;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (&xor_pat,__l_01,(allocator_type *)&local_a8);
  pFVar2 = fsbridge::fopen((char *)&xor_path,"rb");
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&local_178,&xor_pat);
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start._4_4_ = in_stack_fffffffffffff95c;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start._0_4_ = in_stack_fffffffffffff958;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)_cVar11;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff968;
  AutoFile::AutoFile(&xor_file,(FILE *)pFVar2,data_xor);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_178);
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x1b;
  file.m_begin = (iterator)&local_188;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_198,msg);
  ser_writedata8<AutoFile>(&xor_file,'\0');
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x1b;
  file_00.m_begin = (iterator)&local_1a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b8,
             msg_00);
  local_c8._M_dataplus._M_p._0_1_ = 0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "exception std::ios_base::failure expected but not raised";
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_1c0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,&local_a8,1,1,WARN,_cVar11,(size_t)&local_1c8,0x1b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_c8.field_2._M_allocated_capacity);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  file_01.m_end = (iterator)0x1c;
  file_01.m_begin = (iterator)&local_228;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_238,
             msg_01);
  ser_readdata8<AutoFile>(&xor_file);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  file_02.m_end = (iterator)0x1c;
  file_02.m_begin = (iterator)&local_248;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_258,
             msg_02);
  local_c8._M_dataplus._M_p._0_1_ = 0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "exception std::ios_base::failure expected but not raised";
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_260 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,&local_a8,1,1,WARN,_cVar11,(size_t)&local_268,0x1c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_c8.field_2._M_allocated_capacity);
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  file_03.m_end = (iterator)0x1d;
  file_03.m_begin = (iterator)&local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2b8,
             msg_03);
  AutoFile::ignore(&xor_file,1);
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  file_04.m_end = (iterator)0x1d;
  file_04.m_begin = (iterator)&local_2c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2d8,
             msg_04);
  local_c8._M_dataplus._M_p._0_1_ = 0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "exception std::ios_base::failure expected but not raised";
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_2e0 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,&local_a8,1,1,WARN,_cVar11,(size_t)&local_2e8,0x1d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_c8.field_2._M_allocated_capacity);
  AutoFile::~AutoFile(&xor_file);
  pFVar2 = fsbridge::fopen((char *)&xor_path,"wbx");
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)local_330,&xor_pat);
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = uVar8;
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar7;
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)_cVar11;
  data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff968;
  AutoFile::AutoFile(&xor_file,(FILE *)pFVar2,data_xor_00);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(local_330);
  Serialize<AutoFile,unsigned_char,std::allocator<unsigned_char>>(&xor_file,&test1);
  Serialize<AutoFile,unsigned_char,std::allocator<unsigned_char>>(&xor_file,&test2);
  AutoFile::~AutoFile(&xor_file);
  pFVar2 = fsbridge::fopen((char *)&xor_path,"rb");
  local_348._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data_xor_01.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = uVar8;
  data_xor_01.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar7;
  data_xor_01.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)_cVar11;
  data_xor_01.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff968;
  AutoFile::AutoFile(&xor_file,(FILE *)pFVar2,data_xor_01);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_348);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(&raw,7,(allocator_type *)&local_a8);
  local_a8._vptr_lazy_ostream =
       (_func_int **)
       raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
       ._M_start;
  local_a8._8_8_ =
       (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  AutoFile::operator>>(&xor_file,(Span<std::byte> *)&local_a8);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  file_05.m_end = (iterator)0x2e;
  file_05.m_begin = (iterator)&local_358;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_368,
             msg_05);
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_370 = "";
  s.m_size = (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
  s.m_data = raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_c8,s);
  pcVar10 = "\"fc01fd03fd04fa\"";
  pcVar9 = "fc01fd03fd04fa";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_c8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[15]>
            (&local_a8,&local_378,0x2e,1,2,psVar5,0xc3bcac);
  std::__cxx11::string::~string((string *)&local_c8);
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)psVar5;
  msg_06.m_begin = pvVar3;
  file_06.m_end = (iterator)0x30;
  file_06.m_begin = (iterator)&local_388;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_398,
             msg_06);
  AutoFile::ignore(&xor_file,1);
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)psVar5;
  msg_07.m_begin = pvVar3;
  file_07.m_end = (iterator)0x30;
  file_07.m_begin = (iterator)&local_3a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3b8,
             msg_07);
  local_c8._M_dataplus._M_p._0_1_ = 0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "exception std::ios_base::failure expected but not raised";
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_3c0 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,&local_a8,1,1,WARN,(check_type)pcVar9,(size_t)&local_3c8,
             0x30);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_c8.field_2._M_allocated_capacity);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  AutoFile::~AutoFile(&xor_file);
  pFVar2 = fsbridge::fopen((char *)&xor_path,"rb");
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&local_430,&xor_pat);
  data_xor_02.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = uVar8;
  data_xor_02.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar7;
  data_xor_02.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pcVar9;
  data_xor_02.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pcVar10;
  AutoFile::AutoFile(&xor_file,(FILE *)pFVar2,data_xor_02);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_430);
  raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  read2.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  read2.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  read2.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Unserialize<AutoFile,std::byte,std::allocator<std::byte>>(&xor_file,&raw);
  Unserialize<AutoFile,std::byte,std::allocator<std::byte>>(&xor_file,&read2);
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  file_08.m_end = (iterator)0x36;
  file_08.m_begin = (iterator)&local_440;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_450,
             msg_08);
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_458 = "";
  s_00.m_size = (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start;
  s_00.m_data = raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_c8,s_00);
  s_01.m_size = (long)test1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)test1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  s_01.m_data = test1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_e8,s_01);
  pvVar3 = (iterator)0x2;
  psVar5 = &local_c8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_a8,&local_460,0x36,1,2,psVar5,0xc3bd8f,&local_e8,"HexStr(test1)");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)psVar5;
  msg_09.m_begin = pvVar3;
  file_09.m_end = (iterator)0x37;
  file_09.m_begin = (iterator)&local_470;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_480,
             msg_09);
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_488 = "";
  s_02.m_size = (long)read2.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)read2.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start;
  s_02.m_data = read2.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_c8,s_02);
  s_03.m_size = (long)test2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)test2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  psVar5 = &local_e8;
  s_03.m_data = test2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(psVar5,s_03);
  pcVar9 = "HexStr(test2)";
  pvVar3 = (iterator)0x2;
  psVar6 = &local_c8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_a8,&local_490,0x37,1,2,psVar6,0xc3bdab);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)psVar6;
  msg_10.m_begin = pvVar3;
  file_10.m_end = (iterator)0x39;
  file_10.m_begin = (iterator)&local_4a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_4b0,
             msg_10);
  ser_readdata8<AutoFile>(&xor_file);
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = (iterator)psVar6;
  msg_11.m_begin = pvVar3;
  file_11.m_end = (iterator)0x39;
  file_11.m_begin = (iterator)&local_4c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_4d0,
             msg_11);
  local_c8._M_dataplus._M_p._0_1_ = 0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "exception std::ios_base::failure expected but not raised";
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_4d8 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,&local_a8,1,1,WARN,(check_type)psVar5,(size_t)&local_4e0,
             0x39);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_c8.field_2._M_allocated_capacity);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&read2.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  AutoFile::~AutoFile(&xor_file);
  pFVar2 = fsbridge::fopen((char *)&xor_path,"rb");
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)local_548,&xor_pat);
  data_xor_03.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = uVar8;
  data_xor_03.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar7;
  data_xor_03.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)psVar5;
  data_xor_03.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pcVar9;
  AutoFile::AutoFile(&xor_file,(FILE *)pFVar2,data_xor_03);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(local_548);
  raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  AutoFile::ignore(&xor_file,4);
  Unserialize<AutoFile,std::byte,std::allocator<std::byte>>(&xor_file,&raw);
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  file_12.m_end = (iterator)0x41;
  file_12.m_begin = (iterator)&local_558;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_568,
             msg_12);
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_570 = "";
  s_04.m_size = (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start;
  s_04.m_data = raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_c8,s_04);
  s_05.m_size = (long)test2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)test2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  psVar5 = &local_e8;
  s_05.m_data = test2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(psVar5,s_05);
  pvVar3 = (iterator)0x2;
  psVar6 = &local_c8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_a8,&local_578,0x41,1,2,psVar6,0xc3bdab,psVar5,"HexStr(test2)");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = (iterator)psVar6;
  msg_13.m_begin = pvVar3;
  file_13.m_end = (iterator)0x43;
  file_13.m_begin = (iterator)&local_588;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_598,
             msg_13);
  AutoFile::ignore(&xor_file,1);
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = (iterator)psVar6;
  msg_14.m_begin = pvVar3;
  file_14.m_end = (iterator)0x43;
  file_14.m_begin = (iterator)&local_5a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5b8,
             msg_14);
  local_c8._M_dataplus._M_p._0_1_ = 0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "exception std::ios_base::failure expected but not raised";
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_5c0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,&local_a8,1,1,WARN,(check_type)psVar5,(size_t)&local_5c8,
             0x43);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_c8.field_2._M_allocated_capacity);
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar4;
  msg_15.m_begin = pvVar3;
  file_15.m_end = (iterator)0x44;
  file_15.m_begin = (iterator)&local_608;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_618,
             msg_15);
  ser_readdata8<AutoFile>(&xor_file);
  local_628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_620 = "";
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar4;
  msg_16.m_begin = pvVar3;
  file_16.m_end = (iterator)0x44;
  file_16.m_begin = (iterator)&local_628;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_638,
             msg_16);
  local_c8._M_dataplus._M_p._0_1_ = 0;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "exception std::ios_base::failure expected but not raised";
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_640 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,&local_a8,1,1,WARN,(check_type)psVar5,(size_t)&local_648,
             0x44);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_c8.field_2._M_allocated_capacity);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&raw.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  AutoFile::~AutoFile(&xor_file);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&xor_pat.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&test2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&test1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::filesystem::__cxx11::path::~path(&xor_path.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(xor_file)
{
    fs::path xor_path{m_args.GetDataDirBase() / "test_xor.bin"};
    auto raw_file{[&](const auto& mode) { return fsbridge::fopen(xor_path, mode); }};
    const std::vector<uint8_t> test1{1, 2, 3};
    const std::vector<uint8_t> test2{4, 5};
    const std::vector<std::byte> xor_pat{std::byte{0xff}, std::byte{0x00}};
    {
        // Check errors for missing file
        AutoFile xor_file{raw_file("rb"), xor_pat};
        BOOST_CHECK_EXCEPTION(xor_file << std::byte{}, std::ios_base::failure, HasReason{"AutoFile::write: file handle is nullpt"});
        BOOST_CHECK_EXCEPTION(xor_file >> std::byte{}, std::ios_base::failure, HasReason{"AutoFile::read: file handle is nullpt"});
        BOOST_CHECK_EXCEPTION(xor_file.ignore(1), std::ios_base::failure, HasReason{"AutoFile::ignore: file handle is nullpt"});
    }
    {
#ifdef __MINGW64__
        // Temporary workaround for https://github.com/bitcoin/bitcoin/issues/30210
        const char* mode = "wb";
#else
        const char* mode = "wbx";
#endif
        AutoFile xor_file{raw_file(mode), xor_pat};
        xor_file << test1 << test2;
    }
    {
        // Read raw from disk
        AutoFile non_xor_file{raw_file("rb")};
        std::vector<std::byte> raw(7);
        non_xor_file >> Span{raw};
        BOOST_CHECK_EQUAL(HexStr(raw), "fc01fd03fd04fa");
        // Check that no padding exists
        BOOST_CHECK_EXCEPTION(non_xor_file.ignore(1), std::ios_base::failure, HasReason{"AutoFile::ignore: end of file"});
    }
    {
        AutoFile xor_file{raw_file("rb"), xor_pat};
        std::vector<std::byte> read1, read2;
        xor_file >> read1 >> read2;
        BOOST_CHECK_EQUAL(HexStr(read1), HexStr(test1));
        BOOST_CHECK_EQUAL(HexStr(read2), HexStr(test2));
        // Check that eof was reached
        BOOST_CHECK_EXCEPTION(xor_file >> std::byte{}, std::ios_base::failure, HasReason{"AutoFile::read: end of file"});
    }
    {
        AutoFile xor_file{raw_file("rb"), xor_pat};
        std::vector<std::byte> read2;
        // Check that ignore works
        xor_file.ignore(4);
        xor_file >> read2;
        BOOST_CHECK_EQUAL(HexStr(read2), HexStr(test2));
        // Check that ignore and read fail now
        BOOST_CHECK_EXCEPTION(xor_file.ignore(1), std::ios_base::failure, HasReason{"AutoFile::ignore: end of file"});
        BOOST_CHECK_EXCEPTION(xor_file >> std::byte{}, std::ios_base::failure, HasReason{"AutoFile::read: end of file"});
    }
}